

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

int __thiscall Cleaner::CleanRule(Cleaner *this,char *rule)

{
  State *pSVar1;
  int iVar2;
  Rule *rule_00;
  allocator<char> local_41;
  string local_40;
  
  if (rule != (char *)0x0) {
    Reset(this);
    pSVar1 = this->state_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,rule,&local_41);
    rule_00 = BindingEnv::LookupRule(&pSVar1->bindings_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (rule_00 == (Rule *)0x0) {
      Error("unknown rule \'%s\'",rule);
      this->status_ = 1;
      iVar2 = 1;
    }
    else {
      CleanRule(this,rule_00);
      iVar2 = this->status_;
    }
    return iVar2;
  }
  __assert_fail("rule",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean.cc",
                0xf9,"int Cleaner::CleanRule(const char *)");
}

Assistant:

int Cleaner::CleanRule(const char* rule) {
  assert(rule);

  Reset();
  const Rule* r = state_->bindings_.LookupRule(rule);
  if (r) {
    CleanRule(r);
  } else {
    Error("unknown rule '%s'", rule);
    status_ = 1;
  }
  return status_;
}